

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O1

void row_stop(int t)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  
  iVar1 = 4;
  if (t != 6) {
    iVar1 = t;
  }
  if (iVar1 == 7) {
    iVar1 = 0;
  }
  plVar2 = &Seed[0].boundary;
  uVar3 = 0;
  do {
    if ((((seed_t *)(plVar2 + -3))->table == (long)iVar1) ||
       (((seed_t *)(plVar2 + -3))->table == (long)tdefs[iVar1].child)) {
      if ((set_seeds == 0) || (plVar2[-1] <= *plVar2)) {
        NthElement(*plVar2 - plVar2[-1],plVar2 + -2);
      }
      else {
        fprintf(_stderr,"\nSEED CHANGE: seed[%d].usage = %ld\n",uVar3 & 0xffffffff);
        *plVar2 = plVar2[-1];
      }
    }
    uVar3 = uVar3 + 1;
    plVar2 = plVar2 + 4;
  } while (uVar3 != 0x32);
  return;
}

Assistant:

void
row_stop(int t)	\
	{ 
	int i;
	
	/* need to allow for handling the master and detail together */
	if (t == ORDER_LINE)
		t = ORDER;
	if (t == PART_PSUPP)
		t = PART;
	
	for (i=0; i <= MAX_STREAM; i++)
		{
		if ((Seed[i].table == t) || (Seed[i].table == tdefs[t].child))
			{ 
			if (set_seeds && (Seed[i].usage > Seed[i].boundary))
				{
				fprintf(stderr, "\nSEED CHANGE: seed[%d].usage = %ld\n",
					i, Seed[i].usage); 
				Seed[i].boundary = Seed[i].usage;
				} 
			else 
				{
				NthElement((Seed[i].boundary - Seed[i].usage), &Seed[i].value);
				}
			} 
		}
	return;
	}